

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void setb_(PDISASM pMyDisasm)

{
  int iVar1;
  PDISASM pMyDisasm_local;
  
  if ((((pMyDisasm->Reserved_).EVEX.state == '\x01') || ((pMyDisasm->Reserved_).VEX.state != '\x01')
      ) || ((pMyDisasm->Reserved_).VEX.L != '\0')) {
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      failDecode(pMyDisasm);
    }
    else {
      (pMyDisasm->Instruction).Category = 0x10005;
      strcpy((pMyDisasm->Instruction).Mnemonic,"setb");
      (pMyDisasm->Reserved_).MemDecoration = 1;
      (pMyDisasm->Reserved_).OperandSize = 8;
      decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).OperandSize = 0x20;
      (pMyDisasm->Reserved_).EIP_ =
           (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
      FillFlags(pMyDisasm,0x5f);
    }
  }
  else {
    iVar1 = Security(2,pMyDisasm);
    if (iVar1 != 0) {
      (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
      if ((pMyDisasm->Reserved_).MOD_ == 3) {
        if ((pMyDisasm->Reserved_).REX.W_ == '\0') {
          if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
            (pMyDisasm->Instruction).Category = 0x140000;
            strcpy((pMyDisasm->Instruction).Mnemonic,"kmovb");
            (pMyDisasm->Reserved_).OperandSize = 0x20;
            decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
            (pMyDisasm->Reserved_).Register_ = 0x400;
            decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
            (pMyDisasm->Reserved_).EIP_ =
                 (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
          }
          else if ((pMyDisasm->Reserved_).VEX.pp == '\0') {
            (pMyDisasm->Instruction).Category = 0x140000;
            strcpy((pMyDisasm->Instruction).Mnemonic,"kmovw");
            (pMyDisasm->Reserved_).OperandSize = 0x20;
            decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
            (pMyDisasm->Reserved_).Register_ = 0x400;
            decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
            (pMyDisasm->Reserved_).EIP_ =
                 (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
          }
          else if ((pMyDisasm->Reserved_).VEX.pp == '\x03') {
            (pMyDisasm->Instruction).Category = 0x140000;
            strcpy((pMyDisasm->Instruction).Mnemonic,"kmovd");
            (pMyDisasm->Reserved_).OperandSize = 0x20;
            decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
            (pMyDisasm->Reserved_).Register_ = 0x400;
            decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
            (pMyDisasm->Reserved_).EIP_ =
                 (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
          }
          else {
            failDecode(pMyDisasm);
          }
        }
        else if ((pMyDisasm->Reserved_).VEX.pp == '\x03') {
          (pMyDisasm->Instruction).Category = 0x140000;
          strcpy((pMyDisasm->Instruction).Mnemonic,"kmovq");
          (pMyDisasm->Reserved_).OperandSize = 0x40;
          decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
          (pMyDisasm->Reserved_).Register_ = 0x400;
          decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
          (pMyDisasm->Reserved_).EIP_ =
               (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
        }
        else {
          failDecode(pMyDisasm);
        }
      }
      else {
        failDecode(pMyDisasm);
      }
    }
  }
  return;
}

Assistant:

void __bea_callspec__ setb_(PDISASM pMyDisasm)
{
  if (
      (GV.EVEX.state != InUsePrefix) &&
      (GV.VEX.state == InUsePrefix) &&
      (GV.VEX.L == 0)
    ) {
      if (!Security(2, pMyDisasm)) return;
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ == 0x3) {
        if (GV.REX.W_ == 0) {
          if (GV.VEX.pp == 1) {
            pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
            #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kmovb");
            #endif
            GV.OperandSize = 32;
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
            GV.Register_ = OPMASK_REG;
            decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
            GV.EIP_ += GV.DECALAGE_EIP+2;
          }
          else if (GV.VEX.pp == 0) {
            pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
            #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kmovw");
            #endif
            GV.OperandSize = 32;
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
            GV.Register_ = OPMASK_REG;
            decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
            GV.EIP_ += GV.DECALAGE_EIP+2;
          }
          else if (GV.VEX.pp == 3) {
            pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
            #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kmovd");
            #endif
            GV.OperandSize = 32;
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
            GV.Register_ = OPMASK_REG;
            decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
            GV.EIP_ += GV.DECALAGE_EIP+2;
          }
          else {
            failDecode(pMyDisasm);
          }
        }
        else {
          if (GV.VEX.pp == 3) {
            pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
            #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kmovq");
            #endif
            GV.OperandSize = 64;
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
            GV.Register_ = OPMASK_REG;
            decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
            GV.EIP_ += GV.DECALAGE_EIP+2;
          }
          else {
            failDecode(pMyDisasm);
          }
        }
      }
      else {
        failDecode(pMyDisasm);
      }
  }
  else if (GV.VEX.state != InUsePrefix){
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+BIT_UInt8;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "setb");
    #endif
    GV.MemDecoration = Arg1byte;
    GV.OperandSize = 8;
    decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
    GV.OperandSize = 32;
    GV.EIP_+= GV.DECALAGE_EIP+2;
    FillFlags(pMyDisasm,95);
  }
  else {
    failDecode(pMyDisasm);
  }

}